

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgcep.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  Buffer *buffer;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_28;
  ostringstream error_message_27;
  ostringstream error_message_26;
  ostringstream error_message_25;
  ostringstream error_message_24;
  ostringstream error_message_23;
  ostringstream error_message_22;
  ostringstream error_message_21;
  double power;
  vector<double,_std::allocator<double>_> output;
  vector<double,_std::allocator<double>_> processed_input;
  vector<double,_std::allocator<double>_> input;
  int output_length;
  int input_length;
  ostringstream error_message_20;
  Buffer buffer_for_power_normalization;
  MelCepstrumPowerNormalization mel_cepstrum_power_normalization;
  ostringstream error_message_19;
  GeneralizedCepstrumGainNormalization generalized_cepstrum_gain_normalization;
  ostringstream error_message_18;
  MelCepstrumToMlsaDigitalFilterCoefficients mel_cepstrum_to_mlsa_digital_filter_coefficients;
  ostringstream error_message_17;
  Buffer buffer_for_cepstral_analysis;
  MelGeneralizedCepstralAnalysis analysis;
  ostringstream error_message_16;
  Buffer buffer_for_spectral_analysis;
  WaveformToSpectrum waveform_to_spectrum;
  ostringstream error_message_15;
  SpectrumToSpectrum spectrum_to_spectrum;
  istream *input_stream;
  ostringstream error_message_14;
  ifstream ifs;
  ostringstream error_message_13;
  char *input_file;
  ostringstream error_message_12;
  int num_input_files;
  ostringstream error_message_11;
  ostringstream error_message_10;
  ostringstream error_message_9;
  ostringstream error_message_8;
  ostringstream error_message_7;
  ostringstream error_message_6;
  int tmp_2;
  int max_1;
  int min_1;
  ostringstream error_message_5;
  int tmp_1;
  int max;
  int min;
  ostringstream error_message_4;
  ostringstream error_message_3;
  int tmp;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  int impulse_response_length;
  double relative_floor_in_decibels;
  double epsilon;
  double convergence_threshold;
  int num_iteration;
  OutputFormats output_format;
  InputFormats input_format;
  int fft_length;
  double gamma;
  double alpha;
  int num_order;
  option *in_stack_ffffffffffffba98;
  Buffer *buffer_00;
  Buffer *in_stack_ffffffffffffbaa0;
  undefined4 in_stack_ffffffffffffbaa8;
  int in_stack_ffffffffffffbaac;
  WaveformToSpectrum *in_stack_ffffffffffffbab0;
  undefined7 in_stack_ffffffffffffbab8;
  undefined1 in_stack_ffffffffffffbabf;
  Buffer *in_stack_ffffffffffffbac0;
  allocator *paVar5;
  int in_stack_ffffffffffffbac8;
  int in_stack_ffffffffffffbacc;
  MelCepstrumPowerNormalization *in_stack_ffffffffffffbad0;
  undefined7 in_stack_ffffffffffffbad8;
  undefined1 in_stack_ffffffffffffbadf;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffbae0;
  int in_stack_ffffffffffffbae8;
  int in_stack_ffffffffffffbaec;
  WaveformToSpectrum *in_stack_ffffffffffffbaf0;
  int *in_stack_ffffffffffffbb00;
  undefined6 in_stack_ffffffffffffbb18;
  undefined1 in_stack_ffffffffffffbb1e;
  undefined1 in_stack_ffffffffffffbb1f;
  ostream *in_stack_ffffffffffffbb20;
  double in_stack_ffffffffffffbb28;
  double in_stack_ffffffffffffbb30;
  undefined8 in_stack_ffffffffffffbb38;
  MelGeneralizedCepstralAnalysis *in_stack_ffffffffffffbb40;
  double in_stack_ffffffffffffbb48;
  vector<double,_std::allocator<double>_> *mel_generalized_cepstrum;
  undefined4 in_stack_ffffffffffffbb50;
  InputOutputFormats in_stack_ffffffffffffbb54;
  int iVar6;
  MelGeneralizedCepstralAnalysis *in_stack_ffffffffffffbb58;
  undefined7 in_stack_ffffffffffffbb60;
  undefined1 in_stack_ffffffffffffbb67;
  char *local_4448;
  char *local_4400;
  bool local_43d2;
  bool local_43aa;
  bool local_4382;
  allocator *in_stack_ffffffffffffbc88;
  string *in_stack_ffffffffffffbc90;
  bool local_435a;
  bool local_4332;
  byte local_42ea;
  byte local_42a2;
  double local_4268;
  bool local_4242;
  byte local_421a;
  byte local_41f2;
  bool local_41c2;
  undefined1 local_41a1 [33];
  ostringstream local_4180 [383];
  undefined1 local_4001 [33];
  ostringstream local_3fe0 [383];
  allocator local_3e61;
  string local_3e60 [32];
  ostringstream local_3e40 [383];
  allocator local_3cc1;
  string local_3cc0 [32];
  ostringstream local_3ca0 [383];
  allocator local_3b21;
  string local_3b20 [32];
  ostringstream local_3b00 [383];
  allocator local_3981;
  string local_3980 [32];
  ostringstream local_3960 [383];
  allocator local_37e1;
  string local_37e0 [32];
  ostringstream local_37c0 [383];
  allocator local_3641;
  string local_3640 [32];
  ostringstream local_3620 [455];
  vector<double,_std::allocator<double>_> local_3459;
  int local_343c;
  int local_3438;
  allocator local_3431;
  string local_3430 [32];
  ostringstream local_3410 [576];
  MelCepstrumPowerNormalization local_31d0;
  allocator local_3119;
  string local_3118 [32];
  ostringstream local_30f8 [376];
  GeneralizedCepstrumGainNormalization local_2f80;
  allocator local_2f59;
  string local_2f58 [32];
  ostringstream local_2f38 [376];
  MelCepstrumToMlsaDigitalFilterCoefficients local_2dc0;
  allocator local_2d99;
  string local_2d98 [32];
  ostringstream local_2d78 [2312];
  MelGeneralizedCepstralAnalysis local_2470;
  allocator local_2201;
  string local_2200 [32];
  ostringstream local_21e0 [815];
  allocator local_1eb1;
  string local_1eb0 [32];
  ostringstream local_1e90 [376];
  SpectrumToSpectrum local_1d18;
  char *local_1cd0;
  undefined4 local_1cc8;
  allocator local_1cc1;
  string local_1cc0 [32];
  ostringstream local_1ca0 [376];
  char local_1b28 [527];
  allocator local_1919;
  string local_1918 [32];
  ostringstream local_18f8 [376];
  char *local_1780;
  allocator local_1771;
  string local_1770 [32];
  ostringstream local_1750 [376];
  int local_15d8;
  allocator local_15d1;
  string local_15d0 [32];
  ostringstream local_15b0 [383];
  allocator local_1431;
  string local_1430 [39];
  allocator local_1409;
  string local_1408 [32];
  ostringstream local_13e8 [383];
  allocator local_1269;
  string local_1268 [39];
  allocator local_1241;
  string local_1240 [32];
  ostringstream local_1220 [383];
  allocator local_10a1;
  string local_10a0 [39];
  allocator local_1079;
  string local_1078 [32];
  ostringstream local_1058 [383];
  allocator local_ed9;
  string local_ed8 [39];
  allocator local_eb1;
  string local_eb0 [32];
  ostringstream local_e90 [383];
  allocator local_d11;
  string local_d10 [39];
  allocator local_ce9;
  string local_ce8 [32];
  ostringstream local_cc8 [383];
  allocator local_b49;
  string local_b48 [32];
  int local_b28;
  undefined4 local_b24;
  undefined4 local_b20;
  allocator local_b19;
  string local_b18 [32];
  ostringstream local_af8 [383];
  allocator local_979;
  string local_978 [32];
  int local_958;
  undefined4 local_954;
  undefined4 local_950;
  allocator local_949;
  string local_948 [32];
  ostringstream local_928 [383];
  allocator local_7a9;
  string local_7a8 [39];
  allocator local_781;
  string local_780 [32];
  ostringstream local_760 [383];
  allocator local_5e1;
  string local_5e0 [32];
  int local_5c0;
  allocator local_5b9;
  string local_5b8 [32];
  ostringstream local_598 [383];
  allocator local_419;
  string local_418 [39];
  allocator local_3f1;
  string local_3f0 [32];
  ostringstream local_3d0 [383];
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [32];
  ostringstream local_208 [399];
  allocator local_79;
  string local_78 [32];
  int local_58;
  int local_54;
  double local_50;
  double local_48;
  double local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  double local_28;
  double local_20;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x19;
  local_20 = 0.35;
  local_28 = 0.0;
  local_2c = 0x100;
  local_30 = 4;
  local_34 = 0;
  local_38 = 0x1e;
  local_40 = 0.001;
  local_48 = 0.0;
  local_50 = -1.79769313486232e+308;
  local_54 = 0x80;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_58 = ya_getopt_long((int)((ulong)in_stack_ffffffffffffbab0 >> 0x20),
                                   (char **)CONCAT44(in_stack_ffffffffffffbaac,
                                                     in_stack_ffffffffffffbaa8),
                                   (char *)in_stack_ffffffffffffbaa0,in_stack_ffffffffffffba98,
                                   (int *)0x105be1), pcVar1 = ya_optarg, local_58 != -1) {
    switch(local_58) {
    case 0x45:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1268,pcVar1,&local_1269);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                         (double *)in_stack_ffffffffffffbaa0);
      local_43aa = !bVar2 || 0.0 <= local_50;
      std::__cxx11::string::~string(local_1268);
      std::allocator<char>::~allocator((allocator<char> *)&local_1269);
      if (local_43aa) {
        std::__cxx11::ostringstream::ostringstream(local_13e8);
        std::operator<<((ostream *)local_13e8,
                        "The argument for the -E option must be a negative number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1408,"mgcep",&local_1409);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
        std::__cxx11::string::~string(local_1408);
        std::allocator<char>::~allocator((allocator<char> *)&local_1409);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_13e8);
        return local_4;
      }
      break;
    default:
      anon_unknown.dwarf_2fd1::PrintUsage(in_stack_ffffffffffffbb20);
      return 1;
    case 0x61:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_250,pcVar1,&local_251);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                         (double *)in_stack_ffffffffffffbaa0);
      local_41f2 = 1;
      if (bVar2) {
        bVar2 = sptk::IsValidAlpha(local_20);
        local_41f2 = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_250);
      std::allocator<char>::~allocator((allocator<char> *)&local_251);
      if ((local_41f2 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_3d0);
        std::operator<<((ostream *)local_3d0,"The argument for the -a option must be in (-1.0, 1.0)"
                       );
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3f0,"mgcep",&local_3f1);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
        std::__cxx11::string::~string(local_3f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3d0);
        return local_4;
      }
      break;
    case 99:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5e0,pcVar1,&local_5e1);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                         (int *)in_stack_ffffffffffffbaa0);
      local_4242 = !bVar2 || local_5c0 < 0;
      std::__cxx11::string::~string(local_5e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
      if (local_4242) {
        std::__cxx11::ostringstream::ostringstream(local_760);
        poVar4 = std::operator<<((ostream *)local_760,"The argument for the -c option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_780,"mgcep",&local_781);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
        std::__cxx11::string::~string(local_780);
        std::allocator<char>::~allocator((allocator<char> *)&local_781);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_760);
        return local_4;
      }
      if (local_5c0 == 0) {
        local_4268 = 0.0;
      }
      else {
        local_4268 = -1.0 / (double)local_5c0;
      }
      local_28 = local_4268;
      break;
    case 100:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ed8,pcVar1,&local_ed9);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                         (double *)in_stack_ffffffffffffbaa0);
      local_435a = !bVar2 || local_40 < 0.0;
      std::__cxx11::string::~string(local_ed8);
      std::allocator<char>::~allocator((allocator<char> *)&local_ed9);
      if (local_435a) {
        std::__cxx11::ostringstream::ostringstream(local_1058);
        std::operator<<((ostream *)local_1058,
                        "The argument for the -d option must be a non-negative number");
        paVar5 = &local_1079;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1078,"mgcep",paVar5);
        sptk::PrintErrorMessage((string *)paVar5,(ostringstream *)in_stack_ffffffffffffbc88);
        std::__cxx11::string::~string(local_1078);
        std::allocator<char>::~allocator((allocator<char> *)&local_1079);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1058);
        return local_4;
      }
      break;
    case 0x65:
      in_stack_ffffffffffffbc88 = &local_10a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_10a0,pcVar1,in_stack_ffffffffffffbc88);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                         (double *)in_stack_ffffffffffffbaa0);
      local_4382 = !bVar2 || local_48 <= 0.0;
      std::__cxx11::string::~string(local_10a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_10a1);
      if (local_4382) {
        std::__cxx11::ostringstream::ostringstream(local_1220);
        std::operator<<((ostream *)local_1220,
                        "The argument for the -e option must be a positive number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1240,"mgcep",&local_1241);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
        std::__cxx11::string::~string(local_1240);
        std::allocator<char>::~allocator((allocator<char> *)&local_1241);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1220);
        return local_4;
      }
      break;
    case 0x67:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_418,pcVar1,&local_419);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                         (double *)in_stack_ffffffffffffbaa0);
      local_421a = 1;
      if (bVar2) {
        bVar2 = sptk::IsValidGamma(local_28);
        local_421a = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_418);
      std::allocator<char>::~allocator((allocator<char> *)&local_419);
      if ((local_421a & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_598);
        std::operator<<((ostream *)local_598,"The argument for the -g option must be in [-1.0, 0.0]"
                       );
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5b8,"mgcep",&local_5b9);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
        std::__cxx11::string::~string(local_5b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_598);
        return local_4;
      }
      break;
    case 0x68:
      anon_unknown.dwarf_2fd1::PrintUsage(in_stack_ffffffffffffbb20);
      return 0;
    case 0x69:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d10,pcVar1,&local_d11);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                         (int *)in_stack_ffffffffffffbaa0);
      local_4332 = !bVar2 || local_38 < 0;
      std::__cxx11::string::~string(local_d10);
      std::allocator<char>::~allocator((allocator<char> *)&local_d11);
      if (local_4332) {
        std::__cxx11::ostringstream::ostringstream(local_e90);
        std::operator<<((ostream *)local_e90,
                        "The argument for the -i option must be a non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_eb0,"mgcep",&local_eb1);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
        std::__cxx11::string::~string(local_eb0);
        std::allocator<char>::~allocator((allocator<char> *)&local_eb1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_e90);
        return local_4;
      }
      break;
    case 0x6c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7a8,pcVar1,&local_7a9);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                         (int *)in_stack_ffffffffffffbaa0);
      std::__cxx11::string::~string(local_7a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_928);
        std::operator<<((ostream *)local_928,"The argument for the -l option must be an integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_948,"mgcep",&local_949);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
        std::__cxx11::string::~string(local_948);
        std::allocator<char>::~allocator((allocator<char> *)&local_949);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_928);
        return local_4;
      }
      break;
    case 0x6d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,pcVar1,&local_79);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                         (int *)in_stack_ffffffffffffbaa0);
      local_41c2 = !bVar2 || local_14 < 0;
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      if (local_41c2) {
        std::__cxx11::ostringstream::ostringstream(local_208);
        poVar4 = std::operator<<((ostream *)local_208,"The argument for the -m option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_228,"mgcep",&local_229);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
        std::__cxx11::string::~string(local_228);
        std::allocator<char>::~allocator((allocator<char> *)&local_229);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_208);
        return local_4;
      }
      break;
    case 0x6e:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1430,pcVar1,&local_1431);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                         (int *)in_stack_ffffffffffffbaa0);
      local_43d2 = !bVar2 || local_54 < 1;
      std::__cxx11::string::~string(local_1430);
      std::allocator<char>::~allocator((allocator<char> *)&local_1431);
      if (local_43d2) {
        std::__cxx11::ostringstream::ostringstream(local_15b0);
        std::operator<<((ostream *)local_15b0,
                        "The argument for the -n option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_15d0,"mgcep",&local_15d1);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
        std::__cxx11::string::~string(local_15d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_15d1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_15b0);
        return local_4;
      }
      break;
    case 0x6f:
      local_b20 = 0;
      local_b24 = 4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b48,pcVar1,&local_b49);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                         (int *)in_stack_ffffffffffffbaa0);
      local_42ea = 1;
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_b28,0,4);
        local_42ea = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_b48);
      std::allocator<char>::~allocator((allocator<char> *)&local_b49);
      if ((local_42ea & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_cc8);
        poVar4 = std::operator<<((ostream *)local_cc8,
                                 "The argument for the -o option must be an integer ");
        poVar4 = std::operator<<(poVar4,"in the range of ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
        poVar4 = std::operator<<(poVar4," to ");
        std::ostream::operator<<(poVar4,4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_ce8,"mgcep",&local_ce9);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
        std::__cxx11::string::~string(local_ce8);
        std::allocator<char>::~allocator((allocator<char> *)&local_ce9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_cc8);
        return local_4;
      }
      local_34 = local_b28;
      break;
    case 0x71:
      local_950 = 0;
      local_954 = 4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_978,pcVar1,&local_979);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                         (int *)in_stack_ffffffffffffbaa0);
      local_42a2 = 1;
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_958,0,4);
        local_42a2 = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_978);
      std::allocator<char>::~allocator((allocator<char> *)&local_979);
      if ((local_42a2 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_af8);
        poVar4 = std::operator<<((ostream *)local_af8,
                                 "The argument for the -q option must be an integer ");
        poVar4 = std::operator<<(poVar4,"in the range of ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
        poVar4 = std::operator<<(poVar4," to ");
        std::ostream::operator<<(poVar4,4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b18,"mgcep",&local_b19);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
        std::__cxx11::string::~string(local_b18);
        std::allocator<char>::~allocator((allocator<char> *)&local_b19);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_af8);
        return local_4;
      }
      local_30 = local_958;
    }
  }
  local_15d8 = local_8 - ya_optind;
  if (1 < local_15d8) {
    std::__cxx11::ostringstream::ostringstream(local_1750);
    std::operator<<((ostream *)local_1750,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1770,"mgcep",&local_1771);
    sptk::PrintErrorMessage(in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
    std::__cxx11::string::~string(local_1770);
    std::allocator<char>::~allocator((allocator<char> *)&local_1771);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1750);
    return local_4;
  }
  if (local_15d8 == 0) {
    local_4400 = (char *)0x0;
  }
  else {
    local_4400 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_1780 = local_4400;
  bVar2 = sptk::SetBinaryMode();
  iVar6 = (int)((ulong)in_stack_ffffffffffffbb20 >> 0x20);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_18f8);
    std::operator<<((ostream *)local_18f8,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1918,"mgcep",&local_1919);
    sptk::PrintErrorMessage(in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
    std::__cxx11::string::~string(local_1918);
    std::allocator<char>::~allocator((allocator<char> *)&local_1919);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_18f8);
    return local_4;
  }
  std::ifstream::ifstream(local_1b28);
  pcVar1 = local_1780;
  if (local_1780 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_1b28,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_1ca0);
      poVar4 = std::operator<<((ostream *)local_1ca0,"Cannot open file ");
      std::operator<<(poVar4,local_1780);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1cc0,"mgcep",&local_1cc1);
      sptk::PrintErrorMessage(in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
      std::__cxx11::string::~string(local_1cc0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1cc1);
      local_4 = 1;
      local_1cc8 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1ca0);
      goto LAB_00109580;
    }
  }
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) == 0) {
    local_4448 = (char *)&std::cin;
  }
  else {
    local_4448 = local_1b28;
  }
  local_1cd0 = local_4448;
  sptk::SpectrumToSpectrum::SpectrumToSpectrum
            ((SpectrumToSpectrum *)CONCAT17(in_stack_ffffffffffffbb67,in_stack_ffffffffffffbb60),
             (int)((ulong)in_stack_ffffffffffffbb58 >> 0x20),
             (InputOutputFormats)in_stack_ffffffffffffbb58,in_stack_ffffffffffffbb54,
             in_stack_ffffffffffffbb48,(double)in_stack_ffffffffffffbb40);
  if ((local_30 == 4) || (bVar2 = sptk::SpectrumToSpectrum::IsValid(&local_1d18), bVar2)) {
    sptk::WaveformToSpectrum::WaveformToSpectrum
              (in_stack_ffffffffffffbaf0,in_stack_ffffffffffffbaec,in_stack_ffffffffffffbae8,
               (InputOutputFormats)((ulong)in_stack_ffffffffffffbae0 >> 0x20),
               (double)CONCAT17(in_stack_ffffffffffffbadf,in_stack_ffffffffffffbad8),
               (double)in_stack_ffffffffffffbad0);
    sptk::WaveformToSpectrum::Buffer::Buffer((Buffer *)0x107f30);
    if ((local_30 != 4) ||
       (bVar2 = sptk::WaveformToSpectrum::IsValid((WaveformToSpectrum *)0x107f51), bVar2)) {
      sptk::MelGeneralizedCepstralAnalysis::MelGeneralizedCepstralAnalysis
                (in_stack_ffffffffffffbb40,(int)((ulong)in_stack_ffffffffffffbb38 >> 0x20),
                 (int)in_stack_ffffffffffffbb38,in_stack_ffffffffffffbb30,in_stack_ffffffffffffbb28,
                 iVar6,(double)CONCAT17(in_stack_ffffffffffffbb1f,
                                        CONCAT16(in_stack_ffffffffffffbb1e,in_stack_ffffffffffffbb18
                                                )));
      sptk::MelGeneralizedCepstralAnalysis::Buffer::Buffer
                ((Buffer *)CONCAT17(in_stack_ffffffffffffbb67,in_stack_ffffffffffffbb60));
      bVar2 = sptk::MelGeneralizedCepstralAnalysis::IsValid(&local_2470);
      if (bVar2) {
        sptk::MelCepstrumToMlsaDigitalFilterCoefficients::MelCepstrumToMlsaDigitalFilterCoefficients
                  ((MelCepstrumToMlsaDigitalFilterCoefficients *)in_stack_ffffffffffffbab0,
                   in_stack_ffffffffffffbaac,(double)in_stack_ffffffffffffbaa0);
        bVar2 = sptk::MelCepstrumToMlsaDigitalFilterCoefficients::IsValid(&local_2dc0);
        if (bVar2) {
          sptk::GeneralizedCepstrumGainNormalization::GeneralizedCepstrumGainNormalization
                    ((GeneralizedCepstrumGainNormalization *)in_stack_ffffffffffffbab0,
                     in_stack_ffffffffffffbaac,(double)in_stack_ffffffffffffbaa0);
          bVar2 = sptk::GeneralizedCepstrumGainNormalization::IsValid(&local_2f80);
          if (bVar2) {
            sptk::MelCepstrumPowerNormalization::MelCepstrumPowerNormalization
                      (in_stack_ffffffffffffbad0,in_stack_ffffffffffffbacc,in_stack_ffffffffffffbac8
                       ,(double)in_stack_ffffffffffffbac0);
            sptk::MelCepstrumPowerNormalization::Buffer::Buffer(in_stack_ffffffffffffbac0);
            bVar2 = sptk::MelCepstrumPowerNormalization::IsValid(&local_31d0);
            if (bVar2) {
              iVar6 = local_2c;
              if (local_30 != 4) {
                iVar6 = local_2c / 2 + 1;
              }
              local_343c = local_14 + 1;
              buffer = (Buffer *)(long)iVar6;
              mel_generalized_cepstrum = &local_3459;
              local_3438 = iVar6;
              std::allocator<double>::allocator((allocator<double> *)0x10879b);
              std::vector<double,_std::allocator<double>_>::vector
                        ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffbac0,
                         CONCAT17(in_stack_ffffffffffffbabf,in_stack_ffffffffffffbab8),
                         (allocator_type *)in_stack_ffffffffffffbab0);
              std::allocator<double>::~allocator((allocator<double> *)0x1087c7);
              std::allocator<double>::allocator((allocator<double> *)0x1087f8);
              std::vector<double,_std::allocator<double>_>::vector
                        ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffbac0,
                         CONCAT17(in_stack_ffffffffffffbabf,in_stack_ffffffffffffbab8),
                         (allocator_type *)in_stack_ffffffffffffbab0);
              std::allocator<double>::~allocator((allocator<double> *)0x108824);
              std::allocator<double>::allocator((allocator<double> *)0x108849);
              std::vector<double,_std::allocator<double>_>::vector
                        ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffbac0,
                         CONCAT17(in_stack_ffffffffffffbabf,in_stack_ffffffffffffbab8),
                         (allocator_type *)in_stack_ffffffffffffbab0);
              std::allocator<double>::~allocator((allocator<double> *)0x108875);
              do {
                buffer_00 = (Buffer *)0x0;
                bVar2 = sptk::ReadStream<double>
                                  (SUB81((ulong)in_stack_ffffffffffffbaf0 >> 0x30,0),
                                   (int)in_stack_ffffffffffffbaf0,in_stack_ffffffffffffbaec,
                                   in_stack_ffffffffffffbae8,in_stack_ffffffffffffbae0,
                                   (istream *)
                                   CONCAT17(in_stack_ffffffffffffbadf,in_stack_ffffffffffffbad8),
                                   in_stack_ffffffffffffbb00);
                if (!bVar2) {
                  local_4 = 0;
                  local_1cc8 = 1;
                  goto LAB_0010942c;
                }
                if (local_30 == 4) {
                  bVar2 = sptk::WaveformToSpectrum::Run
                                    (in_stack_ffffffffffffbab0,
                                     (vector<double,_std::allocator<double>_> *)
                                     CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                                     (vector<double,_std::allocator<double>_> *)
                                     in_stack_ffffffffffffbaa0,buffer_00);
                  if (!bVar2) {
                    std::__cxx11::ostringstream::ostringstream(local_3620);
                    std::operator<<((ostream *)local_3620,"Failed to transform waveform to spectrum"
                                   );
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_3640,"mgcep",&local_3641);
                    sptk::PrintErrorMessage
                              (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88)
                    ;
                    std::__cxx11::string::~string(local_3640);
                    std::allocator<char>::~allocator((allocator<char> *)&local_3641);
                    local_4 = 1;
                    local_1cc8 = 1;
                    std::__cxx11::ostringstream::~ostringstream(local_3620);
                    goto LAB_0010942c;
                  }
                }
                else {
                  bVar2 = sptk::SpectrumToSpectrum::Run
                                    ((SpectrumToSpectrum *)
                                     CONCAT44(in_stack_ffffffffffffbaec,in_stack_ffffffffffffbae8),
                                     in_stack_ffffffffffffbae0,
                                     (vector<double,_std::allocator<double>_> *)
                                     CONCAT17(in_stack_ffffffffffffbadf,in_stack_ffffffffffffbad8));
                  if (!bVar2) {
                    std::__cxx11::ostringstream::ostringstream(local_37c0);
                    std::operator<<((ostream *)local_37c0,"Failed to convert spectrum");
                    paVar5 = &local_37e1;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_37e0,"mgcep",paVar5);
                    sptk::PrintErrorMessage
                              (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88)
                    ;
                    std::__cxx11::string::~string(local_37e0);
                    std::allocator<char>::~allocator((allocator<char> *)&local_37e1);
                    local_4 = 1;
                    local_1cc8 = 1;
                    std::__cxx11::ostringstream::~ostringstream(local_37c0);
                    goto LAB_0010942c;
                  }
                }
                bVar2 = sptk::MelGeneralizedCepstralAnalysis::Run
                                  (in_stack_ffffffffffffbb58,
                                   (vector<double,_std::allocator<double>_> *)
                                   CONCAT44(iVar6,in_stack_ffffffffffffbb50),
                                   mel_generalized_cepstrum,buffer);
                if (!bVar2) {
                  std::__cxx11::ostringstream::ostringstream(local_3960);
                  std::operator<<((ostream *)local_3960,
                                  "Failed to run mel-generalized cepstral analysis");
                  paVar5 = &local_3981;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_3980,"mgcep",paVar5);
                  sptk::PrintErrorMessage
                            (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
                  std::__cxx11::string::~string(local_3980);
                  std::allocator<char>::~allocator((allocator<char> *)&local_3981);
                  local_4 = 1;
                  local_1cc8 = 1;
                  std::__cxx11::ostringstream::~ostringstream(local_3960);
                  goto LAB_0010942c;
                }
                if (((local_20 != 0.0) || (NAN(local_20))) && ((local_34 == 1 || (local_34 == 3))))
                {
                  bVar2 = sptk::MelCepstrumToMlsaDigitalFilterCoefficients::Run
                                    ((MelCepstrumToMlsaDigitalFilterCoefficients *)
                                     CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                                     (vector<double,_std::allocator<double>_> *)
                                     in_stack_ffffffffffffbaa0);
                  in_stack_ffffffffffffbaec = CONCAT13(bVar2,(int3)in_stack_ffffffffffffbaec);
                  if (!bVar2) {
                    std::__cxx11::ostringstream::ostringstream(local_3b00);
                    std::operator<<((ostream *)local_3b00,
                                    "Failed to convert to MLSA filter coefficients");
                    paVar5 = &local_3b21;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_3b20,"mgcep",paVar5);
                    sptk::PrintErrorMessage
                              (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88)
                    ;
                    std::__cxx11::string::~string(local_3b20);
                    std::allocator<char>::~allocator((allocator<char> *)&local_3b21);
                    local_4 = 1;
                    local_1cc8 = 1;
                    std::__cxx11::ostringstream::~ostringstream(local_3b00);
                    goto LAB_0010942c;
                  }
                }
                if (((local_34 == 2) || (local_34 == 3)) &&
                   (in_stack_ffffffffffffbadf =
                         sptk::GeneralizedCepstrumGainNormalization::Run
                                   ((GeneralizedCepstrumGainNormalization *)
                                    CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                                    (vector<double,_std::allocator<double>_> *)
                                    in_stack_ffffffffffffbaa0), !(bool)in_stack_ffffffffffffbadf)) {
                  std::__cxx11::ostringstream::ostringstream(local_3ca0);
                  std::operator<<((ostream *)local_3ca0,"Failed to gain-normalize cepstrum");
                  paVar5 = &local_3cc1;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_3cc0,"mgcep",paVar5);
                  sptk::PrintErrorMessage
                            (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
                  std::__cxx11::string::~string(local_3cc0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_3cc1);
                  local_4 = 1;
                  local_1cc8 = 1;
                  std::__cxx11::ostringstream::~ostringstream(local_3ca0);
                  goto LAB_0010942c;
                }
                if (local_34 == 4) {
                  bVar2 = sptk::MelCepstrumPowerNormalization::Run
                                    ((MelCepstrumPowerNormalization *)
                                     CONCAT17(in_stack_ffffffffffffbabf,in_stack_ffffffffffffbab8),
                                     (vector<double,_std::allocator<double>_> *)
                                     in_stack_ffffffffffffbab0,
                                     (double *)
                                     CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                                     (Buffer *)in_stack_ffffffffffffbaa0);
                  if (!bVar2) {
                    std::__cxx11::ostringstream::ostringstream(local_3e40);
                    std::operator<<((ostream *)local_3e40,"Failed to power-normalize cepstrum");
                    paVar5 = &local_3e61;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_3e60,"mgcep",paVar5);
                    sptk::PrintErrorMessage
                              (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88)
                    ;
                    std::__cxx11::string::~string(local_3e60);
                    std::allocator<char>::~allocator((allocator<char> *)&local_3e61);
                    local_4 = 1;
                    local_1cc8 = 1;
                    std::__cxx11::ostringstream::~ostringstream(local_3e40);
                    goto LAB_0010942c;
                  }
                  in_stack_ffffffffffffbabf =
                       sptk::WriteStream<double>((double)buffer_00,(ostream *)0x10919c);
                  if (!(bool)in_stack_ffffffffffffbabf) {
                    std::__cxx11::ostringstream::ostringstream(local_3fe0);
                    std::operator<<((ostream *)local_3fe0,"Failed to write power");
                    in_stack_ffffffffffffbab0 = (WaveformToSpectrum *)local_4001;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)(local_4001 + 1),"mgcep",
                               (allocator *)in_stack_ffffffffffffbab0);
                    sptk::PrintErrorMessage
                              (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88)
                    ;
                    std::__cxx11::string::~string((string *)(local_4001 + 1));
                    std::allocator<char>::~allocator((allocator<char> *)local_4001);
                    local_4 = 1;
                    local_1cc8 = 1;
                    std::__cxx11::ostringstream::~ostringstream(local_3fe0);
                    goto LAB_0010942c;
                  }
                }
                bVar2 = sptk::WriteStream<double>
                                  ((int)in_stack_ffffffffffffbaf0,in_stack_ffffffffffffbaec,
                                   in_stack_ffffffffffffbae0,
                                   (ostream *)
                                   CONCAT17(in_stack_ffffffffffffbadf,in_stack_ffffffffffffbad8),
                                   (int *)in_stack_ffffffffffffbad0);
                in_stack_ffffffffffffbaac = CONCAT13(bVar2,(int3)in_stack_ffffffffffffbaac);
              } while (bVar2);
              std::__cxx11::ostringstream::ostringstream(local_4180);
              std::operator<<((ostream *)local_4180,"Failed to write mel-generalized cepstrum");
              in_stack_ffffffffffffbaa0 = (Buffer *)local_41a1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)(local_41a1 + 1),"mgcep",(allocator *)in_stack_ffffffffffffbaa0);
              sptk::PrintErrorMessage
                        (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
              std::__cxx11::string::~string((string *)(local_41a1 + 1));
              std::allocator<char>::~allocator((allocator<char> *)local_41a1);
              local_4 = 1;
              local_1cc8 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_4180);
LAB_0010942c:
              std::vector<double,_std::allocator<double>_>::~vector
                        ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffbab0);
              std::vector<double,_std::allocator<double>_>::~vector
                        ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffbab0);
              std::vector<double,_std::allocator<double>_>::~vector
                        ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffbab0);
            }
            else {
              std::__cxx11::ostringstream::ostringstream(local_3410);
              std::operator<<((ostream *)local_3410,
                              "Failed to set condition for power normalization");
              paVar5 = &local_3431;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_3430,"mgcep",paVar5);
              sptk::PrintErrorMessage
                        (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
              std::__cxx11::string::~string(local_3430);
              std::allocator<char>::~allocator((allocator<char> *)&local_3431);
              local_4 = 1;
              local_1cc8 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_3410);
            }
            sptk::MelCepstrumPowerNormalization::Buffer::~Buffer
                      ((Buffer *)in_stack_ffffffffffffbaa0);
            sptk::MelCepstrumPowerNormalization::~MelCepstrumPowerNormalization
                      ((MelCepstrumPowerNormalization *)in_stack_ffffffffffffbaa0);
          }
          else {
            std::__cxx11::ostringstream::ostringstream(local_30f8);
            std::operator<<((ostream *)local_30f8,"Failed to set condition for gain normalization");
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_3118,"mgcep",&local_3119);
            sptk::PrintErrorMessage
                      (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
            std::__cxx11::string::~string(local_3118);
            std::allocator<char>::~allocator((allocator<char> *)&local_3119);
            local_4 = 1;
            local_1cc8 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_30f8);
          }
          sptk::GeneralizedCepstrumGainNormalization::~GeneralizedCepstrumGainNormalization
                    (&local_2f80);
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_2f38);
          std::operator<<((ostream *)local_2f38,"Failed to set condition for output formatting");
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2f58,"mgcep",&local_2f59);
          sptk::PrintErrorMessage
                    (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
          std::__cxx11::string::~string(local_2f58);
          std::allocator<char>::~allocator((allocator<char> *)&local_2f59);
          local_4 = 1;
          local_1cc8 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_2f38);
        }
        sptk::MelCepstrumToMlsaDigitalFilterCoefficients::
        ~MelCepstrumToMlsaDigitalFilterCoefficients(&local_2dc0);
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_2d78);
        std::operator<<((ostream *)local_2d78,"Failed to set condition for cepstral analysis");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2d98,"mgcep",&local_2d99);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
        std::__cxx11::string::~string(local_2d98);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d99);
        local_4 = 1;
        local_1cc8 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_2d78);
      }
      sptk::MelGeneralizedCepstralAnalysis::Buffer::~Buffer(in_stack_ffffffffffffbaa0);
      sptk::MelGeneralizedCepstralAnalysis::~MelGeneralizedCepstralAnalysis
                ((MelGeneralizedCepstralAnalysis *)in_stack_ffffffffffffbaa0);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_21e0);
      std::operator<<((ostream *)local_21e0,"Failed to set condition for spectral analysis");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2200,"mgcep",&local_2201);
      sptk::PrintErrorMessage(in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
      std::__cxx11::string::~string(local_2200);
      std::allocator<char>::~allocator((allocator<char> *)&local_2201);
      local_4 = 1;
      local_1cc8 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_21e0);
    }
    sptk::WaveformToSpectrum::Buffer::~Buffer((Buffer *)0x109537);
    sptk::WaveformToSpectrum::~WaveformToSpectrum((WaveformToSpectrum *)in_stack_ffffffffffffbaa0);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1e90);
    std::operator<<((ostream *)local_1e90,"Failed to set condition for input formatting");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1eb0,"mgcep",&local_1eb1);
    sptk::PrintErrorMessage(in_stack_ffffffffffffbc90,(ostringstream *)in_stack_ffffffffffffbc88);
    std::__cxx11::string::~string(local_1eb0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1eb1);
    local_4 = 1;
    local_1cc8 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1e90);
  }
  sptk::SpectrumToSpectrum::~SpectrumToSpectrum((SpectrumToSpectrum *)in_stack_ffffffffffffbab0);
LAB_00109580:
  std::ifstream::~ifstream(local_1b28);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  double alpha(kDefaultAlpha);
  double gamma(kDefaultGamma);
  int fft_length(kDefaultFftLength);
  InputFormats input_format(kDefaultInputFormat);
  OutputFormats output_format(kDefaultOutputFormat);
  int num_iteration(kDefaultNumIteration);
  double convergence_threshold(kDefaultConvergenceThreshold);
  double epsilon(0.0);
  double relative_floor_in_decibels(sptk::kMin);
  int impulse_response_length(kDefaultImpulseResponseLength);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "m:a:g:c:l:q:o:i:d:e:E:n:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &alpha) ||
            !sptk::IsValidAlpha(alpha)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -a option must be in (-1.0, 1.0)";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'g': {
        if (!sptk::ConvertStringToDouble(optarg, &gamma) ||
            !sptk::IsValidGamma(gamma)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -g option must be in [-1.0, 0.0]";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) || tmp < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -c option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        gamma = (0 == tmp) ? 0.0 : -1.0 / tmp;
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &num_iteration) ||
            num_iteration < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'd': {
        if (!sptk::ConvertStringToDouble(optarg, &convergence_threshold) ||
            convergence_threshold < 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -d option must be a non-negative number";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToDouble(optarg, &epsilon) || epsilon <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -e option must be a positive number";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'E': {
        if (!sptk::ConvertStringToDouble(optarg, &relative_floor_in_decibels) ||
            0.0 <= relative_floor_in_decibels) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -E option must be a negative number";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'n': {
        if (!sptk::ConvertStringToInteger(optarg, &impulse_response_length) ||
            impulse_response_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -n option must be a positive integer";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("mgcep", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::SpectrumToSpectrum spectrum_to_spectrum(
      fft_length,
      static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(input_format),
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum, epsilon,
      relative_floor_in_decibels);
  if (kWaveform != input_format && !spectrum_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for input formatting";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  sptk::WaveformToSpectrum waveform_to_spectrum(
      fft_length, fft_length,
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum, epsilon,
      relative_floor_in_decibels);
  sptk::WaveformToSpectrum::Buffer buffer_for_spectral_analysis;
  if (kWaveform == input_format && !waveform_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for spectral analysis";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  sptk::MelGeneralizedCepstralAnalysis analysis(fft_length, num_order, alpha,
                                                gamma, num_iteration,
                                                convergence_threshold);
  sptk::MelGeneralizedCepstralAnalysis::Buffer buffer_for_cepstral_analysis;
  if (!analysis.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for cepstral analysis";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  sptk::MelCepstrumToMlsaDigitalFilterCoefficients
      mel_cepstrum_to_mlsa_digital_filter_coefficients(num_order, alpha);
  if (!mel_cepstrum_to_mlsa_digital_filter_coefficients.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for output formatting";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  sptk::GeneralizedCepstrumGainNormalization
      generalized_cepstrum_gain_normalization(num_order, gamma);
  if (!generalized_cepstrum_gain_normalization.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for gain normalization";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  sptk::MelCepstrumPowerNormalization mel_cepstrum_power_normalization(
      num_order, impulse_response_length, alpha);
  sptk::MelCepstrumPowerNormalization::Buffer buffer_for_power_normalization;
  if (!mel_cepstrum_power_normalization.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for power normalization";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  const int input_length(kWaveform == input_format ? fft_length
                                                   : fft_length / 2 + 1);
  const int output_length(num_order + 1);
  std::vector<double> input(input_length);
  std::vector<double> processed_input(fft_length / 2 + 1);
  std::vector<double> output(output_length);
  double power;

  while (sptk::ReadStream(false, 0, 0, input_length, &input, &input_stream,
                          NULL)) {
    if (kWaveform == input_format) {
      if (!waveform_to_spectrum.Run(input, &processed_input,
                                    &buffer_for_spectral_analysis)) {
        std::ostringstream error_message;
        error_message << "Failed to transform waveform to spectrum";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
    } else {
      if (!spectrum_to_spectrum.Run(input, &processed_input)) {
        std::ostringstream error_message;
        error_message << "Failed to convert spectrum";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
    }

    if (!analysis.Run(processed_input, &output,
                      &buffer_for_cepstral_analysis)) {
      std::ostringstream error_message;
      error_message << "Failed to run mel-generalized cepstral analysis";
      sptk::PrintErrorMessage("mgcep", error_message);
      return 1;
    }

    // mc -> b
    if (0.0 != alpha &&
        (kMlsaFilterCoefficients == output_format ||
         kGainNormalizedMlsaFilterCoefficients == output_format)) {
      if (!mel_cepstrum_to_mlsa_digital_filter_coefficients.Run(&output)) {
        std::ostringstream error_message;
        error_message << "Failed to convert to MLSA filter coefficients";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
    }

    // gnorm
    if (kGainNormalizedCepstrum == output_format ||
        kGainNormalizedMlsaFilterCoefficients == output_format) {
      if (!generalized_cepstrum_gain_normalization.Run(&output)) {
        std::ostringstream error_message;
        error_message << "Failed to gain-normalize cepstrum";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
    }

    // pnorm
    if (kPowerNormalizedCepstrum == output_format) {
      if (!mel_cepstrum_power_normalization.Run(
              &output, &power, &buffer_for_power_normalization)) {
        std::ostringstream error_message;
        error_message << "Failed to power-normalize cepstrum";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
      if (!sptk::WriteStream(power, &std::cout)) {
        std::ostringstream error_message;
        error_message << "Failed to write power";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
    }

    if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write mel-generalized cepstrum";
      sptk::PrintErrorMessage("mgcep", error_message);
      return 1;
    }
  }

  return 0;
}